

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlUnnormalize(Ssw_Sml_t *p)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  
  iVar2 = p->nWordsFrame;
  if (0 < (long)iVar2) {
    lVar7 = 0;
    do {
      puVar1 = (uint *)((long)&p[1].pAig + lVar7 * 4);
      *puVar1 = ~*puVar1;
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  pVVar4 = p->pAig->vObjs;
  if (0 < pVVar4->nSize) {
    ppvVar5 = pVVar4->pArray;
    lVar7 = 0;
    do {
      pvVar6 = ppvVar5[lVar7];
      if ((((pvVar6 != (void *)0x0) && ((*(ulong *)((long)pvVar6 + 0x18) & 8) != 0)) &&
          (0xfffffffd < ((uint)*(ulong *)((long)pvVar6 + 0x18) & 7) - 7)) && (0 < p->nWordsFrame)) {
        iVar2 = p->nWordsTotal;
        iVar3 = *(int *)((long)pvVar6 + 0x24);
        lVar8 = 0;
        do {
          puVar1 = (uint *)((long)&p[1].pAig + lVar8 * 4 + (long)(iVar2 * iVar3) * 4);
          *puVar1 = ~*puVar1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < p->nWordsFrame);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Ssw_SmlUnnormalize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int i, k;
    // convert constant 1
    pSims  = Ssw_ObjSim( p, 0 );
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = ~pSims[i];
    // convert internal nodes
    Aig_ManForEachNode( p->pAig, pObj, k )
    {
        if ( pObj->fPhase == 0 )
            continue;
        pSims  = Ssw_ObjSim( p, pObj->Id );
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = ~pSims[i];
    }
    // PIs/POs are always stored in their natural state
}